

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

bool image_match::has_supported_extension(path *ext)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  source_loc loc;
  undefined8 this;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *local_38;
  basic_string_view<char> local_30;
  
  if (spdlog::details::registry::instance()::s_instance == '\0') {
    iVar3 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance);
    if (iVar3 != 0) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
  }
  this = spdlog::details::registry::instance()::s_instance._280_8_;
  pcVar2 = (ext->_M_pathname)._M_dataplus._M_p;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,pcVar2,pcVar2 + (ext->_M_pathname)._M_string_length);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
  ;
  uStack_40 = 0x6c;
  local_38 = "has_supported_extension";
  local_30.data_ = "Checking extension {}";
  local_30.size_ = 0x15;
  loc._12_4_ = uStack_3c;
  loc.line = 0x6c;
  loc.filename = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
  ;
  loc.funcname = "has_supported_extension";
  spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
            ((logger *)this,loc,debug,&local_30,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (ext->_M_pathname)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,pcVar2,pcVar2 + (ext->_M_pathname)._M_string_length);
  pbVar4 = std::
           __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_,SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_,
                      &local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_;
}

Assistant:

bool
has_supported_extension(const std::filesystem::path& ext)
{
    SPDLOG_DEBUG("Checking extension {}", ext.string());

    return std::find(SUPPORTED_IMAGE_EXTENSIONS.begin(),
                     SUPPORTED_IMAGE_EXTENSIONS.end(),
                     ext.string()) != SUPPORTED_IMAGE_EXTENSIONS.end();
}